

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  
  *(undefined ***)this = &PTR__IfcPropertyReferenceValue_008023d8;
  *(undefined ***)&this->field_0xb0 = &PTR__IfcPropertyReferenceValue_00802450;
  *(undefined ***)&this->field_0x58 = &PTR__IfcPropertyReferenceValue_00802400;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcPropertyReferenceValue_00802428;
  this_00 = (this->PropertyReference).
            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
             field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>).
            field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)this = 0x802568;
  *(undefined8 *)&this->field_0xb0 = 0x802590;
  if (*(undefined1 **)&this->field_0x30 != &this->field_0x40) {
    operator_delete(*(undefined1 **)&this->field_0x30,*(long *)&this->field_0x40 + 1);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10,*(long *)&this->field_0x20 + 1);
  }
  operator_delete(this,200);
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}